

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# necro.c
# Opt level: O0

void visceral_three(CHAR_DATA *ch)

{
  long in_RDI;
  char_data **in_stack_00000068;
  _func_void_char_data_ptr *in_stack_00000070;
  string *in_stack_00000078;
  string *in_stack_00000080;
  int in_stack_0000008c;
  CQueue *in_stack_00000090;
  undefined1 in_stack_000012c2;
  undefined1 in_stack_000012c3;
  int in_stack_000012c4;
  int in_stack_000012c8;
  int in_stack_000012cc;
  CHAR_DATA *in_stack_000012d0;
  CHAR_DATA *in_stack_000012d8;
  int in_stack_000012f8;
  int in_stack_00001300;
  char *in_stack_00001308;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff60;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator<char> local_61;
  string local_60 [55];
  allocator<char> local_29;
  string local_28 [32];
  long local_8;
  
  if ((*(byte *)(in_RDI + 0x32c) & 1) == 0) {
    if (*(long *)(in_RDI + 0x20) == 0) {
      act(in_stack_ffffffffffffff60,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
          (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
          (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
      act(in_stack_ffffffffffffff60,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
          (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
          (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
      __a = &local_29;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,__a);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,__a);
      CQueue::AddToQueue<void(*)(char_data*),char_data*&>
                (in_stack_00000090,in_stack_0000008c,in_stack_00000080,in_stack_00000078,
                 in_stack_00000070,in_stack_00000068);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator(&local_61);
      std::__cxx11::string::~string(local_28);
      std::allocator<char>::~allocator(&local_29);
    }
    else {
      local_8 = in_RDI;
      send_to_char(in_stack_ffffffffffffff60,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      act(in_stack_ffffffffffffff60,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
          (void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
          (void *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0);
      dice(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      damage_new(in_stack_000012d8,in_stack_000012d0,in_stack_000012cc,in_stack_000012c8,
                 in_stack_000012c4,(bool)in_stack_000012c3,(bool)in_stack_000012c2,in_stack_000012f8
                 ,in_stack_00001300,in_stack_00001308);
      *(undefined1 *)(local_8 + 0x32c) = 1;
    }
  }
  return;
}

Assistant:

void visceral_three(CHAR_DATA *ch)
{
	if (ch->disrupted)
		return;

	if (ch->fighting)
	{
		send_to_char("The dark powers are furious at the disruption of the unholy orgy!\n\r", ch);

		act("A swirling black cloud coalesces above and lashes out at $n!", ch, nullptr, nullptr, TO_ROOM);

		damage_new(ch, ch, dice(18, 18), gsn_unholy_bond, DAM_NEGATIVE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "a nether bolt*");

		ch->disrupted = true;
		return;
	}

	act("$n and $s minions blissfully writhe in the carnage, praising the Dark Gods.", ch, 0, 0, TO_ROOM);
	act("You blissfully writhe in the carnage, praising the Dark Gods.", ch, 0, 0, TO_CHAR);

	RS.Queue.AddToQueue(6, "visceral_three", "visceral_four", visceral_four, ch);
}